

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O1

int Bdc_DecomposeOr(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  uint *puVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint iVar;
  uint *puVar12;
  ulong uVar13;
  long lVar14;
  uint *puVar15;
  uint uVar16;
  int iVar17;
  
  pIsfL->uSupp = 0;
  pIsfL->uUniq = 0;
  pVVar2 = p->vMemory;
  uVar6 = p->nWords;
  uVar9 = (ulong)uVar6;
  if (uVar9 == 0) {
LAB_005c1ee5:
    puVar15 = (uint *)0x0;
  }
  else {
    if ((int)uVar6 < 1) goto LAB_005c252f;
    lVar14 = (long)(int)uVar6 + (long)pVVar2->nSize;
    iVar8 = (int)lVar14;
    pVVar2->nSize = iVar8;
    if (pVVar2->nCap < iVar8) goto LAB_005c1ee5;
    puVar15 = (uint *)(pVVar2->pArray + (lVar14 - uVar9));
  }
  pIsfL->puOn = puVar15;
  if (uVar9 == 0) {
LAB_005c1f1f:
    puVar12 = (uint *)0x0;
  }
  else {
    if ((int)uVar6 < 1) goto LAB_005c252f;
    lVar14 = (long)(int)uVar6 + (long)pVVar2->nSize;
    iVar8 = (int)lVar14;
    pVVar2->nSize = iVar8;
    if (pVVar2->nCap < iVar8) goto LAB_005c1f1f;
    puVar12 = (uint *)(pVVar2->pArray + (lVar14 - uVar9));
  }
  pIsfL->puOff = puVar12;
  if ((puVar12 == (uint *)0x0) || (puVar15 == (uint *)0x0)) goto LAB_005c254e;
  pIsfR->uSupp = 0;
  pIsfR->uUniq = 0;
  if (uVar9 == 0) {
LAB_005c1f73:
    puVar15 = (uint *)0x0;
  }
  else {
    if ((int)uVar6 < 1) goto LAB_005c252f;
    lVar14 = (long)(int)uVar6 + (long)pVVar2->nSize;
    iVar8 = (int)lVar14;
    pVVar2->nSize = iVar8;
    if (pVVar2->nCap < iVar8) goto LAB_005c1f73;
    puVar15 = (uint *)(pVVar2->pArray + (lVar14 - uVar9));
  }
  pIsfR->puOn = puVar15;
  if (uVar9 == 0) {
LAB_005c1fad:
    puVar12 = (uint *)0x0;
  }
  else {
    if ((int)uVar6 < 1) {
LAB_005c252f:
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar14 = (long)(int)uVar6 + (long)pVVar2->nSize;
    iVar8 = (int)lVar14;
    pVVar2->nSize = iVar8;
    if (pVVar2->nCap < iVar8) goto LAB_005c1fad;
    puVar12 = (uint *)(pVVar2->pArray + (lVar14 - uVar9));
  }
  pIsfR->puOff = puVar12;
  if ((puVar12 != (uint *)0x0) && (puVar15 != (uint *)0x0)) {
    uVar6 = Kit_TruthSupport(pIsf->puOn,p->nVars);
    uVar7 = Kit_TruthSupport(pIsf->puOff,p->nVars);
    if (uVar6 != uVar7) {
      __assert_fail("Kit_TruthSupport(pIsf->puOn, p->nVars) == Kit_TruthSupport(pIsf->puOff, p->nVars)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                    ,0x150,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    uVar6 = pIsf->uSupp;
    uVar7 = Kit_TruthSupport(pIsf->puOn,p->nVars);
    if (uVar6 != uVar7) {
      __assert_fail("pIsf->uSupp == Kit_TruthSupport(pIsf->puOn, p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                    ,0x151,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    iVar8 = Bdc_DecomposeFindInitialVarSet(p,pIsf,pIsfL,pIsfR);
    if (iVar8 == 0) {
      iVar8 = Bdc_DecomposeWeakOr(p,pIsf,pIsfL,pIsfR);
      return iVar8;
    }
    Kit_TruthExistSet(p->puTemp1,pIsf->puOff,p->nVars,pIsfL->uUniq);
    Kit_TruthExistSet(p->puTemp2,pIsf->puOff,p->nVars,pIsfR->uUniq);
    iVar8 = p->nVars;
    if (iVar8 < 1) {
      iVar17 = 1;
      iVar11 = 1;
    }
    else {
      uVar6 = pIsfR->uUniq;
      uVar7 = pIsfL->uUniq;
      uVar1 = pIsf->uSupp;
      iVar = 0;
      iVar11 = 1;
      iVar17 = 1;
      do {
        uVar16 = 1 << ((byte)iVar & 0x1f);
        if (((~(uVar6 | uVar7) & uVar1) >> (iVar & 0x1f) & 1) != 0) {
          Kit_TruthExistNew(p->puTemp3,p->puTemp1,iVar8,iVar);
          Kit_TruthExistNew(p->puTemp4,p->puTemp2,p->nVars,iVar);
          uVar9 = (ulong)(uint)(1 << ((char)p->nVars - 5U & 0x1f));
          if (p->nVars < 6) {
            uVar9 = 1;
          }
          puVar15 = pIsf->puOn;
          iVar8 = (int)uVar9;
          if (iVar17 < iVar11) {
            puVar12 = p->puTemp2;
            puVar3 = p->puTemp3;
            uVar13 = uVar9;
            do {
              iVar10 = (int)uVar13;
              if (iVar10 < 1) goto LAB_005c2215;
              lVar14 = uVar13 - 1;
              lVar4 = uVar13 - 1;
              lVar5 = uVar13 - 1;
              uVar13 = uVar13 - 1;
            } while ((puVar12[lVar5] & puVar3[lVar14] & puVar15[lVar4]) == 0);
            if (iVar10 < 1) {
LAB_005c2215:
              pIsfL->uUniq = pIsfL->uUniq | uVar16;
              iVar17 = iVar17 + 1;
              if (0 < iVar8) {
                puVar15 = p->puTemp1;
                lVar14 = uVar9 + 1;
                do {
                  puVar15[lVar14 + -2] = puVar3[lVar14 + -2];
                  lVar14 = lVar14 + -1;
                } while (1 < lVar14);
              }
            }
            else {
              puVar3 = p->puTemp4;
              uVar13 = uVar9;
              do {
                iVar10 = (int)uVar13;
                if (iVar10 < 1) goto LAB_005c2161;
                lVar14 = uVar13 - 1;
                lVar4 = uVar13 - 1;
                lVar5 = uVar13 - 1;
                uVar13 = uVar13 - 1;
              } while ((p->puTemp1[lVar5] & puVar3[lVar14] & puVar15[lVar4]) == 0);
              if (iVar10 < 1) {
LAB_005c2161:
                pIsfR->uUniq = pIsfR->uUniq | uVar16;
                iVar11 = iVar11 + 1;
                if (0 < iVar8) {
                  lVar14 = uVar9 + 1;
                  do {
                    puVar12[lVar14 + -2] = puVar3[lVar14 + -2];
                    lVar14 = lVar14 + -1;
                  } while (1 < lVar14);
                }
              }
            }
          }
          else {
            puVar12 = p->puTemp1;
            puVar3 = p->puTemp4;
            uVar13 = uVar9;
            do {
              iVar10 = (int)uVar13;
              if (iVar10 < 1) goto LAB_005c223e;
              lVar14 = uVar13 - 1;
              lVar4 = uVar13 - 1;
              lVar5 = uVar13 - 1;
              uVar13 = uVar13 - 1;
            } while ((puVar12[lVar5] & puVar3[lVar14] & puVar15[lVar4]) == 0);
            if (iVar10 < 1) {
LAB_005c223e:
              pIsfR->uUniq = pIsfR->uUniq | uVar16;
              iVar11 = iVar11 + 1;
              if (0 < iVar8) {
                puVar15 = p->puTemp2;
                lVar14 = uVar9 + 1;
                do {
                  puVar15[lVar14 + -2] = puVar3[lVar14 + -2];
                  lVar14 = lVar14 + -1;
                } while (1 < lVar14);
              }
            }
            else {
              puVar3 = p->puTemp3;
              uVar13 = uVar9;
              do {
                iVar10 = (int)uVar13;
                if (iVar10 < 1) goto LAB_005c21f0;
                lVar14 = uVar13 - 1;
                lVar4 = uVar13 - 1;
                lVar5 = uVar13 - 1;
                uVar13 = uVar13 - 1;
              } while ((p->puTemp2[lVar5] & puVar3[lVar14] & puVar15[lVar4]) == 0);
              if (iVar10 < 1) {
LAB_005c21f0:
                pIsfL->uUniq = pIsfL->uUniq | uVar16;
                iVar17 = iVar17 + 1;
                if (0 < iVar8) {
                  lVar14 = uVar9 + 1;
                  do {
                    puVar12[lVar14 + -2] = puVar3[lVar14 + -2];
                    lVar14 = lVar14 + -1;
                  } while (1 < lVar14);
                }
              }
            }
          }
        }
        iVar = iVar + 1;
        iVar8 = p->nVars;
      } while ((int)iVar < iVar8);
    }
    puVar15 = pIsfL->puOn;
    uVar6 = 1 << ((char)iVar8 - 5U & 0x1f);
    if (iVar8 < 6) {
      uVar6 = 1;
    }
    if (0 < (int)uVar6) {
      puVar12 = pIsf->puOn;
      puVar3 = p->puTemp1;
      lVar14 = (ulong)uVar6 + 1;
      do {
        puVar15[lVar14 + -2] = puVar3[lVar14 + -2] & puVar12[lVar14 + -2];
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    Kit_TruthExistSet(puVar15,puVar15,p->nVars,pIsfR->uUniq);
    puVar15 = pIsfL->puOff;
    puVar12 = p->puTemp2;
    uVar6 = 1 << ((char)p->nVars - 5U & 0x1f);
    if (p->nVars < 6) {
      uVar6 = 1;
    }
    if (0 < (int)uVar6) {
      lVar14 = (ulong)uVar6 + 1;
      do {
        puVar15[lVar14 + -2] = puVar12[lVar14 + -2];
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    uVar6 = 1 << ((char)p->nVars - 5U & 0x1f);
    if (p->nVars < 6) {
      uVar6 = 1;
    }
    uVar13 = (ulong)uVar6;
    uVar9 = uVar13;
    do {
      iVar8 = (int)uVar9;
      if (iVar8 < 1) goto LAB_005c24b3;
      lVar14 = uVar9 - 1;
      uVar9 = uVar9 - 1;
    } while (pIsfL->puOn[lVar14] == 0);
    uVar9 = uVar13;
    if (iVar8 < 1) {
LAB_005c24b3:
      __assert_fail("!Kit_TruthIsConst0(pIsfL->puOn, p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                    ,0x19a,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    do {
      iVar8 = (int)uVar9;
      if (iVar8 < 1) goto LAB_005c24d2;
      lVar14 = uVar9 - 1;
      uVar9 = uVar9 - 1;
    } while (puVar15[lVar14] == 0);
    if (iVar8 < 1) {
LAB_005c24d2:
      __assert_fail("!Kit_TruthIsConst0(pIsfL->puOff, p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                    ,0x19b,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    puVar15 = pIsfR->puOn;
    if (0 < (int)uVar6) {
      puVar3 = pIsf->puOn;
      lVar14 = uVar13 + 1;
      do {
        puVar15[lVar14 + -2] = puVar12[lVar14 + -2] & puVar3[lVar14 + -2];
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    Kit_TruthExistSet(puVar15,puVar15,p->nVars,pIsfL->uUniq);
    puVar15 = pIsfR->puOff;
    uVar6 = 1 << ((char)p->nVars - 5U & 0x1f);
    if (p->nVars < 6) {
      uVar6 = 1;
    }
    if (0 < (int)uVar6) {
      puVar12 = p->puTemp1;
      lVar14 = (ulong)uVar6 + 1;
      do {
        puVar15[lVar14 + -2] = puVar12[lVar14 + -2];
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    iVar8 = p->nVars;
    uVar6 = 1 << ((char)iVar8 - 5U & 0x1f);
    if (iVar8 < 6) {
      uVar6 = 1;
    }
    uVar13 = (ulong)uVar6;
    uVar9 = uVar13;
    do {
      iVar10 = (int)uVar9;
      if (iVar10 < 1) goto LAB_005c24f1;
      lVar14 = uVar9 - 1;
      uVar9 = uVar9 - 1;
    } while (pIsfR->puOn[lVar14] == 0);
    if (iVar10 < 1) {
LAB_005c24f1:
      __assert_fail("!Kit_TruthIsConst0(pIsfR->puOn, p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                    ,0x1a8,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    do {
      iVar10 = (int)uVar13;
      if (iVar10 < 1) goto LAB_005c2510;
      lVar14 = uVar13 - 1;
      uVar13 = uVar13 - 1;
    } while (puVar15[lVar14] == 0);
    if (0 < iVar10) {
      if (pIsfL->uUniq == 0) {
        __assert_fail("pIsfL->uUniq",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                      ,0x1ac,
                      "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)");
      }
      if (pIsfR->uUniq == 0) {
        __assert_fail("pIsfR->uUniq",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                      ,0x1ad,
                      "int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)");
      }
      if (iVar17 < 1) {
        __assert_fail("nLeftVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                      ,0xbc,"int Bdc_DecomposeGetCost(Bdc_Man_t *, int, int)");
      }
      if (iVar11 < 1) {
        __assert_fail("nRightVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                      ,0xbd,"int Bdc_DecomposeGetCost(Bdc_Man_t *, int, int)");
      }
      iVar10 = iVar8 * iVar17 + iVar11;
      if (iVar11 <= iVar17) {
        iVar10 = iVar8 * iVar11 + iVar17;
      }
      return iVar10 * 1000;
    }
LAB_005c2510:
    __assert_fail("!Kit_TruthIsConst0(pIsfR->puOff, p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                  ,0x1a9,"int Bdc_DecomposeOr(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)");
  }
LAB_005c254e:
  __assert_fail("pF->puOff && pF->puOn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcInt.h"
                ,0x83,"void Bdc_IsfStart(Bdc_Man_t *, Bdc_Isf_t *)");
}

Assistant:

int Bdc_DecomposeOr( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    unsigned uSupportRem;
    int v, nLeftVars = 1, nRightVars = 1; 
    // clean the var sets
    Bdc_IsfStart( p, pIsfL );
    Bdc_IsfStart( p, pIsfR );
    // check that the support is correct
    assert( Kit_TruthSupport(pIsf->puOn, p->nVars) == Kit_TruthSupport(pIsf->puOff, p->nVars) );
    assert( pIsf->uSupp == Kit_TruthSupport(pIsf->puOn, p->nVars) );
    // find initial variable sets
    if ( !Bdc_DecomposeFindInitialVarSet( p, pIsf, pIsfL, pIsfR ) )
        return Bdc_DecomposeWeakOr( p, pIsf, pIsfL, pIsfR );
    // prequantify the variables in the offset
    Kit_TruthExistSet( p->puTemp1, pIsf->puOff, p->nVars, pIsfL->uUniq ); 
    Kit_TruthExistSet( p->puTemp2, pIsf->puOff, p->nVars, pIsfR->uUniq );
    // go through the remaining variables
    uSupportRem = pIsf->uSupp & ~pIsfL->uUniq & ~pIsfR->uUniq;
    for ( v = 0; v < p->nVars; v++ )
    {
        if ( (uSupportRem & (1 << v)) == 0 )
            continue;
        // prequantify this variable
        Kit_TruthExistNew( p->puTemp3, p->puTemp1, p->nVars, v );
        Kit_TruthExistNew( p->puTemp4, p->puTemp2, p->nVars, v );
        if ( nLeftVars < nRightVars )
        {
//            if ( (Q & bdd_exist( pF->R, pL->V & VarNew ) & bdd_exist( pF->R, pR->V )) == bddfalse )
//            if ( VerifyORCondition( dd, pF->Q, pF->R, pL->V, pR->V, VarNew ) )
            if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp3, p->puTemp2, p->nVars) )
            {
//                pL->V &= VarNew;
                pIsfL->uUniq |= (1 << v);
                nLeftVars++;
                Kit_TruthCopy( p->puTemp1, p->puTemp3, p->nVars );
            }
//            else if ( (Q & bdd_exist( pF->R, pR->V & VarNew ) & bdd_exist( pF->R, pL->V )) == bddfalse )
            else if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp4, p->puTemp1, p->nVars) )
            {
//                pR->V &= VarNew;
                pIsfR->uUniq |= (1 << v);
                nRightVars++;
                Kit_TruthCopy( p->puTemp2, p->puTemp4, p->nVars );
            }
        }
        else
        {
//            if ( (Q & bdd_exist( pF->R, pR->V & VarNew ) & bdd_exist( pF->R, pL->V )) == bddfalse )
            if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp4, p->puTemp1, p->nVars) )
            {
//                pR->V &= VarNew;
                pIsfR->uUniq |= (1 << v);
                nRightVars++;
                Kit_TruthCopy( p->puTemp2, p->puTemp4, p->nVars );
            }
//            else if ( (Q & bdd_exist( pF->R, pL->V & VarNew ) & bdd_exist( pF->R, pR->V )) == bddfalse )
            else if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp3, p->puTemp2, p->nVars) )
            {
//                pL->V &= VarNew;
                pIsfL->uUniq |= (1 << v);
                nLeftVars++;
                Kit_TruthCopy( p->puTemp1, p->puTemp3, p->nVars );
            }
        }
    }

    // derive the functions Q and R for the left branch
//    pL->Q = bdd_appex( pF->Q, bdd_exist( pF->R, pL->V ), bddop_and, pR->V );
//    pL->R = bdd_exist( pF->R, pR->V );

//    Temp = Cudd_bddExistAbstract( dd, pF->R, pL->V );      Cudd_Ref( Temp );
//    pL->Q = Cudd_bddAndAbstract( dd, pF->Q, Temp, pR->V ); Cudd_Ref( pL->Q );
//    Cudd_RecursiveDeref( dd, Temp );
//    pL->R = Cudd_bddExistAbstract( dd, pF->R, pR->V );     Cudd_Ref( pL->R );

    Kit_TruthAnd( pIsfL->puOn, pIsf->puOn, p->puTemp1, p->nVars );
    Kit_TruthExistSet( pIsfL->puOn, pIsfL->puOn, p->nVars, pIsfR->uUniq );
    Kit_TruthCopy( pIsfL->puOff, p->puTemp2, p->nVars );

//    assert( pL->Q != b0 );
//    assert( pL->R != b0 );
//    assert( Cudd_bddIteConstant( dd, pL->Q, pL->R, b0 ) == b0 );
    assert( !Kit_TruthIsConst0(pIsfL->puOn, p->nVars) );
    assert( !Kit_TruthIsConst0(pIsfL->puOff, p->nVars) );
//    assert( Kit_TruthIsDisjoint(pIsfL->puOn, pIsfL->puOff, p->nVars) );

    // derive the functions Q and R for the right branch
//    Temp = Cudd_bddExistAbstract( dd, pF->R, pR->V );      Cudd_Ref( Temp );
//    pR->Q = Cudd_bddAndAbstract( dd, pF->Q, Temp, pL->V ); Cudd_Ref( pR->Q );
//    Cudd_RecursiveDeref( dd, Temp );
//    pR->R = Cudd_bddExistAbstract( dd, pF->R, pL->V );     Cudd_Ref( pR->R );

    Kit_TruthAnd( pIsfR->puOn, pIsf->puOn, p->puTemp2, p->nVars );
    Kit_TruthExistSet( pIsfR->puOn, pIsfR->puOn, p->nVars, pIsfL->uUniq );
    Kit_TruthCopy( pIsfR->puOff, p->puTemp1, p->nVars );

    assert( !Kit_TruthIsConst0(pIsfR->puOn, p->nVars) );
    assert( !Kit_TruthIsConst0(pIsfR->puOff, p->nVars) );
//    assert( Kit_TruthIsDisjoint(pIsfR->puOn, pIsfR->puOff, p->nVars) );

    assert( pIsfL->uUniq );
    assert( pIsfR->uUniq );
    return Bdc_DecomposeGetCost( p, nLeftVars, nRightVars );        
}